

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  int iVar1;
  ulong uVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  double dVar3;
  float logMax;
  int i_1;
  int offset_1;
  int l_1;
  float oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  float max;
  int k;
  int endPattern;
  int startPattern;
  bool useLogScalars;
  int local_5c;
  int local_58;
  int local_54;
  int local_4c;
  int local_48;
  int local_44;
  float local_3c;
  int local_38;
  
  uVar2 = *(ulong *)(in_RDI + 0x58);
  iVar1 = *(int *)(*(long *)(in_RDI + 0x88) + (long)(in_R9D + 1) * 4);
  for (local_38 = *(int *)(*(long *)(in_RDI + 0x88) + (long)in_R9D * 4); local_38 < iVar1;
      local_38 = local_38 + 1) {
    local_3c = 0.0;
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x34); local_44 = local_44 + 1) {
      local_48 = local_44 * *(int *)(in_RDI + 0x18) * 4 + local_38 * 4;
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        if (local_3c < *(float *)(in_RSI + (long)local_48 * 4)) {
          local_3c = *(float *)(in_RSI + (long)local_48 * 4);
        }
        local_48 = local_48 + 1;
      }
    }
    if ((local_3c == 0.0) && (!NAN(local_3c))) {
      local_3c = 1.0;
    }
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x34); local_54 = local_54 + 1) {
      local_58 = local_54 * *(int *)(in_RDI + 0x18) * 4 + local_38 * 4;
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        *(float *)(in_RSI + (long)local_58 * 4) =
             (1.0 / local_3c) * *(float *)(in_RSI + (long)local_58 * 4);
        local_58 = local_58 + 1;
      }
    }
    if ((uVar2 & 0x400) == 0) {
      *(float *)(in_RDX + (long)local_38 * 4) = local_3c;
      if (in_RCX != 0) {
        dVar3 = log((double)local_3c);
        *(float *)(in_RCX + (long)local_38 * 4) =
             (float)((double)*(float *)(in_RCX + (long)local_38 * 4) + dVar3);
      }
    }
    else {
      dVar3 = log((double)local_3c);
      *(float *)(in_RDX + (long)local_38 * 4) = (float)dVar3;
      if (in_RCX != 0) {
        *(float *)(in_RCX + (long)local_38 * 4) =
             (float)dVar3 + *(float *)(in_RCX + (long)local_38 * 4);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}